

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * String::fromHex(String *__return_storage_ptr__,byte *data,usize size)

{
  byte *end;
  byte *src;
  char *hex;
  char *dest;
  usize size_local;
  byte *data_local;
  String *result;
  
  String(__return_storage_ptr__);
  resize(__return_storage_ptr__,size * 2);
  hex = operator_cast_to_char_(__return_storage_ptr__);
  for (end = data; end < data + size; end = end + 1) {
    *hex = "0123456789ABCDEF"[(int)(uint)*end >> 4];
    hex[1] = "0123456789ABCDEF"[(int)(*end & 0xf)];
    hex = hex + 2;
  }
  return __return_storage_ptr__;
}

Assistant:

String String::fromHex(const byte* data, usize size)
{
  String result;
  result.resize(size * 2);
  char* dest = result;
  const char* hex = "0123456789ABCDEF";
  for(const byte* src =  data, * end = data + size; src < end; ++src)
  {
    dest[0] = hex[*src >> 4];
    dest[1] = hex[*src & 0xf];
    dest += 2;
  }
  return result;
}